

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O2

void __thiscall trimesh::mscomplex_t::connect_cps(mscomplex_t *this,int p,int q)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  int __c;
  int __c_00;
  int q_local;
  int p_local;
  key_type_conflict local_1c8 [8];
  stringstream ss;
  ostream local_198 [376];
  
  q_local = q;
  p_local = p;
  order_pr_by_cp_index(this,&p_local,&q_local);
  pcVar2 = index(this,(char *)(ulong)(uint)p_local,__c);
  pcVar3 = index(this,(char *)(ulong)(uint)q_local,__c_00);
  if ((int)pcVar2 != (int)pcVar3 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_198,"Failed to assert condition ");
    poVar6 = std::operator<<(poVar6,"index(p) == index(q)+1");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"at (");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = std::operator<<(poVar6,"connect_cps");
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11a);
    std::operator<<(poVar6,") \n ");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1c8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_not_paired(this,p_local);
  if (bVar1) {
    bVar1 = is_not_paired(this,q_local);
    if (bVar1) {
      _ss = q_local;
      sVar4 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->m_des_conn->
                       super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[p_local]._M_t,
                      (key_type_conflict *)&ss);
      local_1c8[0] = p_local;
      sVar5 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->m_asc_conn->
                       super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[q_local]._M_t,local_1c8);
      if (sVar4 == sVar5) {
        _ss = q_local;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_equal<unsigned_int>
                  (&(this->m_des_conn->
                    super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[p_local]._M_t,(uint *)&ss);
        _ss = p_local;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_equal<unsigned_int>
                  (&(this->m_asc_conn->
                    super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[q_local]._M_t,(uint *)&ss);
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_198,"Failed to assert condition ");
      poVar6 = std::operator<<(poVar6,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"at (");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                              );
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = std::operator<<(poVar6,"connect_cps");
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11c);
      std::operator<<(poVar6,") \n ");
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar7,(string *)local_1c8);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<(local_198,"Failed to assert condition ");
  poVar6 = std::operator<<(poVar6,"is_not_paired(p) && is_not_paired(q)");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"at (");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                          );
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = std::operator<<(poVar6,"connect_cps");
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11b);
  std::operator<<(poVar6,") \n ");
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,(string *)local_1c8);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::connect_cps(int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ASSERT(index(p) == index(q)+1);
  ASSERT(is_not_paired(p) && is_not_paired(q));
  ASSERT(m_des_conn[p].count(q) == m_asc_conn[q].count(p));

  m_des_conn[p].insert(q);
  m_asc_conn[q].insert(p);
}